

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

void nifti_mat44_to_quatern
               (mat44 R,float *qb,float *qc,float *qd,float *qx,float *qy,float *qz,float *dx,
               float *dy,float *dz,float *qfac)

{
  mat33 A;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double __x;
  undefined8 in_stack_fffffffffffffe1c;
  undefined1 local_124 [36];
  float fStack_100;
  float fStack_fc;
  mat33 Q;
  mat33 P;
  double d;
  double c;
  double b;
  double a;
  double zd;
  double yd;
  double xd;
  double r33;
  double r32;
  double r31;
  double r23;
  double r22;
  double r21;
  double r13;
  double r12;
  double r11;
  float *qz_local;
  float *qy_local;
  float *qx_local;
  float *qd_local;
  float *qc_local;
  float *qb_local;
  
  if (qx != (float *)0x0) {
    *qx = R.m[0][3];
  }
  if (qy != (float *)0x0) {
    *qy = R.m[1][3];
  }
  if (qz != (float *)0x0) {
    *qz = R.m[2][3];
  }
  r12 = (double)R.m[0][0];
  r13 = (double)R.m[0][1];
  r21 = (double)R.m[0][2];
  r22 = (double)R.m[1][0];
  r23 = (double)R.m[1][1];
  r31 = (double)R.m[1][2];
  r32 = (double)R.m[2][0];
  r33 = (double)R.m[2][1];
  xd = (double)R.m[2][2];
  yd = sqrt(r32 * r32 + r12 * r12 + r22 * r22);
  zd = sqrt(r33 * r33 + r13 * r13 + r23 * r23);
  a = sqrt(xd * xd + r21 * r21 + r31 * r31);
  if ((yd == 0.0) && (!NAN(yd))) {
    r12 = 1.0;
    r32 = 0.0;
    r22 = 0.0;
    yd = 1.0;
  }
  if ((zd == 0.0) && (!NAN(zd))) {
    r23 = 1.0;
    r33 = 0.0;
    r13 = 0.0;
    zd = 1.0;
  }
  if ((a == 0.0) && (!NAN(a))) {
    xd = 1.0;
    r31 = 0.0;
    r21 = 0.0;
    a = 1.0;
  }
  if (dx != (float *)0x0) {
    *dx = (float)yd;
  }
  if (dy != (float *)0x0) {
    *dy = (float)zd;
  }
  if (dz != (float *)0x0) {
    *dz = (float)a;
  }
  fStack_100 = (float)(r12 / yd);
  fStack_fc = (float)(r13 / zd);
  Q.m[0][0] = (float)(r21 / a);
  Q.m[0][1] = (float)(r22 / yd);
  Q.m[0][2] = (float)(r23 / zd);
  Q.m[1][0] = (float)(r31 / a);
  Q.m[1][1] = (float)(r32 / yd);
  Q.m[1][2] = (float)(r33 / zd);
  Q.m[2][0] = (float)(xd / a);
  A.m[0][1] = Q.m[0][1];
  A.m[0][0] = Q.m[0][0];
  A.m[1][0] = Q.m[1][0];
  A.m[0][2] = Q.m[0][2];
  A.m[1][2] = Q.m[1][2];
  A.m[1][1] = Q.m[1][1];
  A.m[2][0] = Q.m[2][0];
  A.m[2][1] = (float)(int)in_stack_fffffffffffffe1c;
  A.m[2][2] = (float)(int)((ulong)in_stack_fffffffffffffe1c >> 0x20);
  nifti_mat33_polar(A);
  memcpy(Q.m[2] + 1,local_124,0x24);
  dVar1 = (double)Q.m[2][1];
  dVar2 = (double)Q.m[2][2];
  r21 = (double)P.m[0][0];
  dVar3 = (double)P.m[0][1];
  dVar4 = (double)P.m[0][2];
  r31 = (double)P.m[1][0];
  dVar5 = (double)P.m[1][1];
  dVar6 = (double)P.m[1][2];
  xd = (double)P.m[2][0];
  if (-(dVar5 * dVar4) * r21 +
      dVar5 * dVar2 * r31 +
      dVar3 * dVar6 * r21 + -(dVar3 * dVar2) * xd + dVar1 * dVar4 * xd + -(dVar1 * dVar6 * r31) <=
      0.0) {
    if (qfac != (float *)0x0) {
      *qfac = -1.0;
    }
    r21 = -r21;
    r31 = -r31;
    xd = -xd;
  }
  else if (qfac != (float *)0x0) {
    *qfac = 1.0;
  }
  dVar7 = dVar1 + dVar4 + xd + 1.0;
  if (dVar7 <= 0.5) {
    dVar7 = (dVar1 + 1.0) - (dVar4 + xd);
    __x = (dVar4 + 1.0) - (dVar1 + xd);
    if (dVar7 <= 1.0) {
      if (__x <= 1.0) {
        dVar1 = sqrt((xd + 1.0) - (dVar1 + dVar4));
        P.m[2]._4_8_ = dVar1 * 0.5;
        c = ((r21 + dVar5) * 0.25) / (double)P.m[2]._4_8_;
        d = ((r31 + dVar6) * 0.25) / (double)P.m[2]._4_8_;
        b = ((dVar3 - dVar2) * 0.25) / (double)P.m[2]._4_8_;
      }
      else {
        dVar1 = sqrt(__x);
        d = dVar1 * 0.5;
        c = ((dVar2 + dVar3) * 0.25) / d;
        P.m[2]._4_8_ = ((r31 + dVar6) * 0.25) / d;
        b = ((r21 - dVar5) * 0.25) / d;
      }
    }
    else {
      dVar1 = sqrt(dVar7);
      c = dVar1 * 0.5;
      d = ((dVar2 + dVar3) * 0.25) / c;
      P.m[2]._4_8_ = ((r21 + dVar5) * 0.25) / c;
      b = ((dVar6 - r31) * 0.25) / c;
    }
    if (b < 0.0) {
      c = -c;
      d = -d;
      P.m[2]._4_8_ = P.m[2]._4_8_ ^ 0x8000000000000000;
    }
  }
  else {
    dVar1 = sqrt(dVar7);
    dVar1 = dVar1 * 0.5;
    c = ((dVar6 - r31) * 0.25) / dVar1;
    d = ((r21 - dVar5) * 0.25) / dVar1;
    P.m[2]._4_8_ = ((dVar3 - dVar2) * 0.25) / dVar1;
  }
  if (qb != (float *)0x0) {
    *qb = (float)c;
  }
  if (qc != (float *)0x0) {
    *qc = (float)d;
  }
  if (qd != (float *)0x0) {
    *qd = (float)(double)P.m[2]._4_8_;
  }
  return;
}

Assistant:

void nifti_mat44_to_quatern( mat44 R ,
                             float *qb, float *qc, float *qd,
                             float *qx, float *qy, float *qz,
                             float *dx, float *dy, float *dz, float *qfac )
{
   double r11,r12,r13 , r21,r22,r23 , r31,r32,r33 ;
   double xd,yd,zd , a,b,c,d ;
   mat33 P,Q ;

   /* offset outputs are read write out of input matrix  */

   ASSIF(qx,R.m[0][3]) ; ASSIF(qy,R.m[1][3]) ; ASSIF(qz,R.m[2][3]) ;

   /* load 3x3 matrix into local variables */

   r11 = R.m[0][0] ; r12 = R.m[0][1] ; r13 = R.m[0][2] ;
   r21 = R.m[1][0] ; r22 = R.m[1][1] ; r23 = R.m[1][2] ;
   r31 = R.m[2][0] ; r32 = R.m[2][1] ; r33 = R.m[2][2] ;

   /* compute lengths of each column; these determine grid spacings  */

   xd = sqrt( r11*r11 + r21*r21 + r31*r31 ) ;
   yd = sqrt( r12*r12 + r22*r22 + r32*r32 ) ;
   zd = sqrt( r13*r13 + r23*r23 + r33*r33 ) ;

   /* if a column length is zero, patch the trouble */

   if( xd == 0.0l ){ r11 = 1.0l ; r21 = r31 = 0.0l ; xd = 1.0l ; }
   if( yd == 0.0l ){ r22 = 1.0l ; r12 = r32 = 0.0l ; yd = 1.0l ; }
   if( zd == 0.0l ){ r33 = 1.0l ; r13 = r23 = 0.0l ; zd = 1.0l ; }

   /* assign the output lengths */

   ASSIF(dx,(float)xd) ; ASSIF(dy,(float)yd) ; ASSIF(dz,(float)zd) ;

   /* normalize the columns */

   r11 /= xd ; r21 /= xd ; r31 /= xd ;
   r12 /= yd ; r22 /= yd ; r32 /= yd ;
   r13 /= zd ; r23 /= zd ; r33 /= zd ;

   /* At this point, the matrix has normal columns, but we have to allow
      for the fact that the hideous user may not have given us a matrix
      with orthogonal columns.

      So, now find the orthogonal matrix closest to the current matrix.

      One reason for using the polar decomposition to get this
      orthogonal matrix, rather than just directly orthogonalizing
      the columns, is so that inputting the inverse matrix to R
      will result in the inverse orthogonal matrix at this point.
      If we just orthogonalized the columns, this wouldn't necessarily hold. */

   Q.m[0][0] = (float)r11 ; Q.m[0][1] = (float)r12 ; Q.m[0][2] = (float)r13 ; /* load Q */
   Q.m[1][0] = (float)r21 ; Q.m[1][1] = (float)r22 ; Q.m[1][2] = (float)r23 ;
   Q.m[2][0] = (float)r31 ; Q.m[2][1] = (float)r32 ; Q.m[2][2] = (float)r33 ;

   P = nifti_mat33_polar(Q) ;  /* P is orthog matrix closest to Q */

   r11 = P.m[0][0] ; r12 = P.m[0][1] ; r13 = P.m[0][2] ; /* unload */
   r21 = P.m[1][0] ; r22 = P.m[1][1] ; r23 = P.m[1][2] ;
   r31 = P.m[2][0] ; r32 = P.m[2][1] ; r33 = P.m[2][2] ;

   /*                            [ r11 r12 r13 ]               */
   /* at this point, the matrix  [ r21 r22 r23 ] is orthogonal */
   /*                            [ r31 r32 r33 ]               */

   /* compute the determinant to determine if it is proper */

   zd = r11*r22*r33-r11*r32*r23-r21*r12*r33
       +r21*r32*r13+r31*r12*r23-r31*r22*r13 ;  /* should be -1 or 1 */

   if( zd > 0 ){             /* proper */
     ASSIF(qfac,1.0f) ;
   } else {                  /* improper ==> flip 3rd column */
     ASSIF(qfac,-1.0f) ;
     r13 = -r13 ; r23 = -r23 ; r33 = -r33 ;
   }

   /* now, compute quaternion parameters */

   a = r11 + r22 + r33 + 1.0l ;

   if( a > 0.5l ){                /* simplest case */
     a = 0.5l * sqrt(a) ;
     b = 0.25l * (r32-r23) / a ;
     c = 0.25l * (r13-r31) / a ;
     d = 0.25l * (r21-r12) / a ;
   } else {                       /* trickier case */
     xd = 1.0 + r11 - (r22+r33) ;  /* 4*b*b */
     yd = 1.0 + r22 - (r11+r33) ;  /* 4*c*c */
     zd = 1.0 + r33 - (r11+r22) ;  /* 4*d*d */
     if( xd > 1.0 ){
       b = 0.5l * sqrt(xd) ;
       c = 0.25l* (r12+r21) / b ;
       d = 0.25l* (r13+r31) / b ;
       a = 0.25l* (r32-r23) / b ;
     } else if( yd > 1.0 ){
       c = 0.5l * sqrt(yd) ;
       b = 0.25l* (r12+r21) / c ;
       d = 0.25l* (r23+r32) / c ;
       a = 0.25l* (r13-r31) / c ;
     } else {
       d = 0.5l * sqrt(zd) ;
       b = 0.25l* (r13+r31) / d ;
       c = 0.25l* (r23+r32) / d ;
       a = 0.25l* (r21-r12) / d ;
     }
     if( a < 0.0l ){ b=-b ; c=-c ; d=-d; a=-a; }
   }

   ASSIF(qb,(float)b) ; ASSIF(qc,(float)c) ; ASSIF(qd,(float)d) ;
   return ;
}